

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::Generator::
PrintDescriptorOptionsFixingCode<google::protobuf::OneofDescriptor>
          (Generator *this,OneofDescriptor *descriptor,Proto *proto,string_view descriptor_str)

{
  bool bVar1;
  size_type __n;
  char *pcVar2;
  undefined1 *this_00;
  AlphaNum *pAVar3;
  AlphaNum *in_R9;
  string_view text;
  string_view serialized_options;
  string_view descriptor_str_local;
  string descriptor_name;
  string_view local_120;
  string options;
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  
  pAVar3 = (AlphaNum *)descriptor_str._M_str;
  pcVar2 = (char *)descriptor_str._M_len;
  this_00 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((OneofOptions *)this_00 == (OneofOptions *)0x0) {
    this_00 = _OneofOptions_default_instance_;
  }
  descriptor_str_local._M_len = (size_t)pcVar2;
  descriptor_str_local._M_str = (char *)pAVar3;
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_120,(MessageLite *)this_00);
  serialized_options._M_str = pcVar2;
  serialized_options._M_len = local_120._M_len;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            (&options,(_anonymous_namespace_ *)local_120._M_str,serialized_options);
  std::__cxx11::string::~string((string *)&local_120);
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&descriptor_str_local,'.',0);
  descriptor_name._M_dataplus._M_p = (pointer)&descriptor_name.field_2;
  descriptor_name._M_string_length = 0;
  descriptor_name.field_2._M_local_buf[0] = '\0';
  if (__n == 0xffffffffffffffff) {
    local_120 = absl::lts_20250127::NullSafeStringView("_globals[\'");
    local_a0.piece_._M_str = descriptor_str_local._M_str;
    local_a0.piece_._M_len = descriptor_str_local._M_len;
    local_d0.piece_ = absl::lts_20250127::NullSafeStringView("\']");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_70,(lts_20250127 *)&local_120,&local_a0,&local_d0,pAVar3);
    pAVar3 = &local_70;
  }
  else {
    local_120 = absl::lts_20250127::NullSafeStringView("_globals[\'");
    local_a0.piece_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr(&descriptor_str_local,0,__n);
    local_d0.piece_ = absl::lts_20250127::NullSafeStringView("\']");
    local_70.piece_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (&descriptor_str_local,__n,0xffffffffffffffff);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_40,(lts_20250127 *)&local_120,&local_a0,&local_d0,&local_70,in_R9);
    pAVar3 = (AlphaNum *)&local_40;
  }
  std::__cxx11::string::operator=((string *)&descriptor_name,(string *)pAVar3);
  std::__cxx11::string::~string((string *)pAVar3);
  bVar1 = std::operator==(&options,"None");
  if (!bVar1) {
    text._M_str = 
    "$descriptor_name$._loaded_options = None\n$descriptor_name$._serialized_options = $serialized_value$\n"
    ;
    text._M_len = 100;
    io::Printer::Print<char[16],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,text,(char (*) [16])0xffc89a,&descriptor_name,
               (char (*) [17])"serialized_value",&options);
  }
  std::__cxx11::string::~string((string *)&descriptor_name);
  std::__cxx11::string::~string((string *)&options);
  return !bVar1;
}

Assistant:

bool Generator::PrintDescriptorOptionsFixingCode(
    const DescriptorT& descriptor, const typename DescriptorT::Proto& proto,
    absl::string_view descriptor_str) const {
  std::string options = OptionsValue(proto.options().SerializeAsString());

  // Reset the _options to None thus DescriptorBase.GetOptions() can
  // parse _options again after extensions are registered.
  size_t dot_pos = descriptor_str.find('.');
  std::string descriptor_name;
  if (dot_pos == std::string::npos) {
    descriptor_name = absl::StrCat("_globals['", descriptor_str, "']");
  } else {
    descriptor_name =
        absl::StrCat("_globals['", descriptor_str.substr(0, dot_pos), "']",
                     descriptor_str.substr(dot_pos));
  }

  if (options == "None") {
    return false;
  }

  printer_->Print(
      "$descriptor_name$._loaded_options = None\n"
      "$descriptor_name$._serialized_options = $serialized_value$\n",
      "descriptor_name", descriptor_name, "serialized_value", options);
  return true;
}